

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mfsrin(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 ret;
  TCGv_i64 t0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->pr & 1U) == 0) {
    ret = tcg_temp_new_i64(tcg_ctx_00);
    uVar1 = rB(ctx->opcode);
    tcg_gen_extract_i64_ppc64(tcg_ctx_00,ret,cpu_gpr[uVar1],0x1c,4);
    uVar1 = rD(ctx->opcode);
    gen_helper_load_sr(tcg_ctx_00,cpu_gpr[uVar1],tcg_ctx_00->cpu_env,ret);
    tcg_temp_free_i64(tcg_ctx_00,ret);
  }
  else {
    gen_priv_exception(ctx,1);
  }
  return;
}

Assistant:

static void gen_mfsrin(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;

    CHK_SV;
    t0 = tcg_temp_new(tcg_ctx);
    tcg_gen_extract_tl(tcg_ctx, t0, cpu_gpr[rB(ctx->opcode)], 28, 4);
    gen_helper_load_sr(tcg_ctx, cpu_gpr[rD(ctx->opcode)], tcg_ctx->cpu_env, t0);
    tcg_temp_free(tcg_ctx, t0);
}